

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::CreateReferencedPropertyIdMap(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  PropertyId *pPVar3;
  undefined4 *puVar4;
  Recycler *pRVar5;
  int *propIdMap;
  uint local_54;
  uint i;
  TrackAllocData local_40;
  uint local_14;
  FunctionBody *pFStack_10;
  uint count;
  FunctionBody *this_local;
  
  pFStack_10 = this;
  pPVar3 = GetReferencedPropertyIdMap(this);
  if (pPVar3 != (PropertyId *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x10bd,"(this->GetReferencedPropertyIdMap() == nullptr)",
                                "this->GetReferencedPropertyIdMap() == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  local_14 = GetReferencedPropertyIdCount(this);
  if (local_14 != 0) {
    pRVar5 = ScriptContext::GetRecycler
                       ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&int::typeinfo,0,(ulong)local_14,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
               ,0x10c1);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_40);
    propIdMap = Memory::AllocateArray<Memory::Recycler,int,false>
                          ((Memory *)pRVar5,(Recycler *)Memory::Recycler::AllocLeaf,0,
                           (ulong)local_14);
    SetReferencedPropertyIdMap(this,propIdMap);
    for (local_54 = 0; local_54 < local_14; local_54 = local_54 + 1) {
      pPVar3 = GetReferencedPropertyIdMap(this);
      pPVar3[local_54] = -1;
    }
  }
  return;
}

Assistant:

void FunctionBody::CreateReferencedPropertyIdMap()
    {
        Assert(this->GetReferencedPropertyIdMap() == nullptr);
        uint count = this->GetReferencedPropertyIdCount();
        if (count!= 0)
        {
            this->SetReferencedPropertyIdMap(RecyclerNewArrayLeaf(this->m_scriptContext->GetRecycler(), PropertyId, count));
#if DBG
            for (uint i = 0; i < count; i++)
            {
                this->GetReferencedPropertyIdMap()[i] = Js::Constants::NoProperty;
            }
#endif
        }
    }